

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_ellipse.cpp
# Opt level: O1

int distSqToEllipse(void *p,double t,double *f,double *df)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar1 = cos(t);
  dVar2 = sin(t);
  dVar4 = *p * dVar1 - *(double *)((long)p + 0x10);
  dVar3 = *(double *)((long)p + 8) * dVar2 - *(double *)((long)p + 0x18);
  if (f != (double *)0x0) {
    *f = dVar4 * dVar4 + dVar3 * dVar3;
  }
  if (df != (double *)0x0) {
    dVar1 = dVar3 * *(double *)((long)p + 8) * dVar1 - dVar2 * dVar4 * *p;
    *df = dVar1 + dVar1;
  }
  return 0;
}

Assistant:

static int distSqToEllipse(void* p, double t, double* f, double* df )
{
  // used in call to TL_NRdbrent().
  double dx, dy, st, ct;
  const double* a = (const double*)p;
  // a[0], a[1] = x/y radii of 2d ellipse
  // (a[2],a[3]) = 2d point
  // f(t) = distance squared from ellipse(t) to 2d point
  ct = cos(t);
  st = sin(t);
  dx = ct*a[0] - a[2];
  dy = st*a[1] - a[3];
  if ( f ) {
    *f = dx*dx + dy*dy;
  }
  if ( df ) {
    *df = 2.0*(dy*a[1]*ct - dx*a[0]*st);
  }
  return 0;
}